

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_sse2.cpp
# Opt level: O3

void src_Source(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  undefined1 auVar1 [15];
  uint3 uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  int iVar31;
  int iVar32;
  long lVar33;
  bool bVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  short sVar42;
  undefined2 uVar43;
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar44 [16];
  byte bVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar71;
  ushort uVar72;
  int5 iVar67;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar68 [12];
  undefined1 auVar69 [14];
  undefined1 auVar70 [16];
  
  if (const_alpha == 0xff) {
    memcpy(dest,src,(long)length << 2);
    return;
  }
  iVar31 = 0xff - const_alpha;
  auVar39._0_8_ = CONCAT44(const_alpha,const_alpha);
  auVar39._8_4_ = const_alpha;
  if (length != 0 && ((ulong)dest & 0xf) != 0) {
    lVar33 = 0;
    iVar35 = length;
    do {
      *(uint *)((long)dest + lVar33) =
           (*(uint *)((long)dest + lVar33) >> 8 & 0xff00ff) * iVar31 +
           (*(uint *)((long)src + lVar33) >> 8 & 0xff00ff) * const_alpha & 0xff00ff00 |
           (*(uint *)((long)dest + lVar33) & 0xff00ff) * iVar31 +
           (*(uint *)((long)src + lVar33) & 0xff00ff) * const_alpha >> 8 & 0xff00ff;
      length = iVar35 + -1;
      iVar36 = (int)lVar33;
      lVar33 = lVar33 + 4;
      if (((int)dest + 4 + iVar36 & 0xfU) == 0) break;
      bVar34 = iVar35 != 1;
      iVar35 = length;
    } while (bVar34);
    dest = (uint32_t *)((long)dest + lVar33);
    src = (uint32_t *)((long)src + lVar33);
  }
  uVar43 = (undefined2)(const_alpha >> 0x10);
  auVar47._12_2_ = uVar43;
  auVar47._0_12_ = auVar39;
  auVar47._14_2_ = uVar43;
  sVar42 = (short)const_alpha;
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = auVar39._0_10_;
  auVar46._10_2_ = sVar42;
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._8_2_ = sVar42;
  auVar45._0_8_ = auVar39._0_8_;
  auVar44._8_8_ = auVar45._8_8_;
  auVar44._6_2_ = uVar43;
  auVar44._4_2_ = uVar43;
  auVar44._0_4_ = const_alpha;
  auVar40._0_8_ = CONCAT26(uVar43,CONCAT24(uVar43,CONCAT22(sVar42,sVar42)));
  auVar40._8_2_ = sVar42;
  auVar40._10_2_ = sVar42;
  auVar41._12_2_ = uVar43;
  auVar41._0_12_ = auVar40;
  auVar41._14_2_ = uVar43;
  iVar35 = CONCAT22(sVar42,sVar42) + auVar44._4_4_;
  iVar36 = auVar45._8_4_ + auVar46._12_4_;
  iVar37 = CONCAT22(sVar42,sVar42) + (int)((ulong)auVar40._0_8_ >> 0x20);
  iVar38 = auVar40._8_4_ + auVar41._12_4_;
  do {
    if (length - 1U < 3) {
      *(uint *)*(undefined1 (*) [16])dest =
           (*(uint *)*(undefined1 (*) [16])dest >> 8 & 0xff00ff) * iVar31 +
           (*(uint *)*(undefined1 (*) [16])src >> 8 & 0xff00ff) * const_alpha & 0xff00ff00 |
           (*(uint *)*(undefined1 (*) [16])dest & 0xff00ff) * iVar31 +
           (*(uint *)*(undefined1 (*) [16])src & 0xff00ff) * const_alpha >> 8 & 0xff00ff;
      iVar32 = -1;
      lVar33 = 4;
    }
    else {
      if (length == 0) {
        return;
      }
      auVar41 = *(undefined1 (*) [16])src;
      auVar44 = *(undefined1 (*) [16])dest;
      auVar1[0xd] = 0;
      auVar1._0_13_ = auVar41._0_13_;
      auVar1[0xe] = auVar41[7];
      auVar4[0xc] = auVar41[6];
      auVar4._0_12_ = auVar41._0_12_;
      auVar4._13_2_ = auVar1._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar41._0_11_;
      auVar6._12_3_ = auVar4._12_3_;
      auVar8[10] = auVar41[5];
      auVar8._0_10_ = auVar41._0_10_;
      auVar8._11_4_ = auVar6._11_4_;
      auVar10[9] = 0;
      auVar10._0_9_ = auVar41._0_9_;
      auVar10._10_5_ = auVar8._10_5_;
      auVar12[8] = auVar41[4];
      auVar12._0_8_ = auVar41._0_8_;
      auVar12._9_6_ = auVar10._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar12._8_7_;
      Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar41[3]);
      auVar24._9_6_ = 0;
      auVar24._0_9_ = Var19;
      auVar20._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar20[0] = auVar41[2];
      auVar25._11_4_ = 0;
      auVar25._0_11_ = auVar20;
      auVar16[2] = auVar41[1];
      auVar16._0_2_ = auVar41._0_2_;
      auVar16._3_12_ = SUB1512(auVar25 << 0x20,3);
      auVar28[10] = 0;
      auVar28._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar28[0xb] = auVar44[5];
      auVar29[9] = auVar44[4];
      auVar29._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar29._10_2_ = auVar28._10_2_;
      auVar30._9_3_ = auVar29._9_3_;
      auVar30._0_9_ = (unkuint9)0;
      auVar45 = ZEXT516(CONCAT41(auVar30._8_4_,auVar44[3])) << 0x38;
      auVar14._1_10_ = auVar45._6_10_;
      auVar14[0] = auVar44[2];
      auVar14._11_5_ = 0;
      auVar13._1_12_ = SUB1612(auVar14 << 0x28,4);
      auVar13[0] = auVar44[1];
      auVar13._13_3_ = 0;
      uVar2 = CONCAT12(auVar44[9],(ushort)auVar44[8]);
      iVar67 = (uint5)uVar2 << 8;
      bVar48 = auVar44[0xb];
      auVar68._0_10_ = CONCAT19(auVar44[0xc],(unkuint9)bVar48 << 0x38);
      auVar68[10] = 0;
      auVar68[0xb] = auVar44[0xd];
      auVar69[0xc] = 0;
      auVar69._0_12_ = auVar68;
      auVar69[0xd] = auVar44[0xe];
      auVar70[0xe] = 0;
      auVar70._0_14_ = auVar69;
      auVar70[0xf] = auVar44[0xf];
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar44._0_13_;
      auVar3[0xe] = auVar44[7];
      auVar5[0xc] = auVar44[6];
      auVar5._0_12_ = auVar44._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar44._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar44[5];
      auVar9._0_10_ = auVar44._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar44._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar15[8] = auVar44[4];
      auVar15._0_8_ = auVar44._0_8_;
      auVar15._9_6_ = auVar11._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar15._8_7_;
      Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),auVar44[3]);
      auVar26._9_6_ = 0;
      auVar26._0_9_ = Var22;
      auVar23._1_10_ = SUB1510(auVar26 << 0x30,5);
      auVar23[0] = auVar44[2];
      auVar27._11_4_ = 0;
      auVar27._0_11_ = auVar23;
      auVar17[2] = auVar44[1];
      auVar17._0_2_ = auVar44._0_2_;
      auVar17._3_12_ = SUB1512(auVar27 << 0x20,3);
      uVar49 = (auVar4._12_2_ - auVar5._12_2_) * (short)iVar36;
      uVar50 = ((auVar1._13_2_ >> 8) - (auVar3._13_2_ >> 8)) * (short)((uint)iVar36 >> 0x10);
      uVar51 = (ushort)auVar44[0] * 0x100 +
               ((auVar41._0_2_ & 0xff) - (auVar44._0_2_ & 0xff)) * sVar42;
      uVar53 = SUB162(auVar13 << 0x18,2) + (auVar16._2_2_ - auVar17._2_2_) * sVar42;
      uVar55 = SUB162(auVar14 << 0x28,4) + (auVar20._0_2_ - auVar23._0_2_) * (short)iVar35;
      uVar57 = auVar45._6_2_ + ((short)Var19 - (short)Var22) * (short)((uint)iVar35 >> 0x10);
      uVar59 = auVar30._8_2_ + (auVar12._8_2_ - auVar15._8_2_) * sVar42;
      uVar61 = auVar28._10_2_ + (auVar8._10_2_ - auVar9._10_2_) * sVar42;
      uVar65 = (short)iVar67 + ((ushort)auVar41[8] - (ushort)auVar44[8]) * sVar42;
      uVar71 = (short)(uVar2 >> 8) + ((ushort)auVar41[9] - (ushort)auVar44[9]) * sVar42;
      uVar73 = (short)(CONCAT15(auVar44[10],iVar67) >> 0x20) +
               ((ushort)auVar41[10] - (ushort)auVar44[10]) * (short)iVar37;
      uVar75 = (short)(((ulong)bVar48 << 0x38) >> 0x30) +
               ((ushort)auVar41[0xb] - (ushort)bVar48) * (short)((uint)iVar37 >> 0x10);
      uVar77 = (short)(auVar68._0_10_ >> 0x40) +
               ((ushort)auVar41[0xc] - (ushort)auVar44[0xc]) * sVar42;
      uVar79 = auVar68._10_2_ + ((ushort)auVar41[0xd] - (ushort)auVar44[0xd]) * sVar42;
      uVar81 = auVar69._12_2_ + ((ushort)auVar41[0xe] - (ushort)auVar44[0xe]) * (short)iVar38;
      uVar83 = auVar70._14_2_ +
               ((ushort)auVar41[0xf] - (ushort)auVar44[0xf]) * (short)((uint)iVar38 >> 0x10);
      uVar52 = uVar51 >> 8;
      uVar54 = uVar53 >> 8;
      uVar56 = uVar55 >> 8;
      uVar58 = uVar57 >> 8;
      uVar60 = uVar59 >> 8;
      uVar62 = uVar61 >> 8;
      uVar63 = uVar49 >> 8;
      uVar64 = uVar50 >> 8;
      uVar66 = uVar65 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar80 = uVar79 >> 8;
      uVar82 = uVar81 >> 8;
      uVar84 = uVar83 >> 8;
      (*(undefined1 (*) [16])dest)[0] =
           (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      (*(undefined1 (*) [16])dest)[1] =
           (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      (*(undefined1 (*) [16])dest)[2] =
           (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
      (*(undefined1 (*) [16])dest)[3] =
           (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
      (*(undefined1 (*) [16])dest)[4] =
           (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
      (*(undefined1 (*) [16])dest)[5] =
           (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
      (*(undefined1 (*) [16])dest)[6] =
           (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar63);
      (*(undefined1 (*) [16])dest)[7] =
           (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar64);
      (*(undefined1 (*) [16])dest)[8] =
           (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
      (*(undefined1 (*) [16])dest)[9] =
           (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      (*(undefined1 (*) [16])dest)[10] =
           (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      (*(undefined1 (*) [16])dest)[0xb] =
           (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      (*(undefined1 (*) [16])dest)[0xc] =
           (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      (*(undefined1 (*) [16])dest)[0xd] =
           (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
      (*(undefined1 (*) [16])dest)[0xe] =
           (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
      (*(undefined1 (*) [16])dest)[0xf] =
           (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
      iVar32 = -4;
      lVar33 = 0x10;
    }
    dest = (uint32_t *)(*(undefined1 (*) [16])dest + lVar33);
    src = (uint32_t *)(*(undefined1 (*) [16])src + lVar33);
    length = length + iVar32;
  } while( true );
}

Assistant:

static void src_Source(uint32_t* dest, int length, const uint32_t* src,
                           uint32_t const_alpha)
{
    int ialpha;
    if (const_alpha == 255) {
        memcpy(dest, src, length * sizeof(uint32_t));
    } else {
        ialpha = 255 - const_alpha;
        __m128i v_alpha = _mm_set1_epi32(const_alpha);

        LOOP_ALIGNED_U1_A4(dest, length,
                           { /* UOP */
                             *dest = interpolate_pixel(*src, const_alpha,
                                                       *dest, ialpha);
                             dest++;
                             src++;
                             length--;
                           },
                           {/* A4OP */
                            V4_FETCH_SRC_DEST V4_COMP_OP_SRC V4_STORE_DEST
                                                             V4_SRC_DEST_LEN_INC})
    }
}